

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool trans_FMLA_zzxz(DisasContext_conflict1 *s,arg_FMLA_zzxz *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  uint32_t oprsz;
  uint32_t dofs;
  uint32_t aofs;
  uint32_t bofs;
  uint32_t cofs;
  TCGv_ptr ptr;
  TCGv_ptr status;
  uint vsz;
  TCGContext_conflict1 *tcg_ctx;
  arg_FMLA_zzxz *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  _Var1 = sve_access_check_aarch64(s);
  if (_Var1) {
    oprsz = vec_full_reg_size(s);
    ptr = get_fpstatus_ptr_aarch64(tcg_ctx_00,a->esz == 1);
    dofs = vec_full_reg_offset(s,a->rd);
    aofs = vec_full_reg_offset(s,a->rn);
    bofs = vec_full_reg_offset(s,a->rm);
    cofs = vec_full_reg_offset(s,a->ra);
    tcg_gen_gvec_4_ptr_aarch64
              (tcg_ctx_00,dofs,aofs,bofs,cofs,ptr,oprsz,oprsz,a->index << 1 | a->sub,
               trans_FMLA_zzxz::fns[a->esz + -1]);
    tcg_temp_free_ptr(tcg_ctx_00,ptr);
  }
  return true;
}

Assistant:

static bool trans_FMLA_zzxz(DisasContext *s, arg_FMLA_zzxz *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    static gen_helper_gvec_4_ptr * const fns[3] = {
        gen_helper_gvec_fmla_idx_h,
        gen_helper_gvec_fmla_idx_s,
        gen_helper_gvec_fmla_idx_d,
    };

    if (sve_access_check(s)) {
        unsigned vsz = vec_full_reg_size(s);
        TCGv_ptr status = get_fpstatus_ptr(tcg_ctx, a->esz == MO_16);
        tcg_gen_gvec_4_ptr(tcg_ctx, vec_full_reg_offset(s, a->rd),
                           vec_full_reg_offset(s, a->rn),
                           vec_full_reg_offset(s, a->rm),
                           vec_full_reg_offset(s, a->ra),
                           status, vsz, vsz, (a->index << 1) | a->sub,
                           fns[a->esz - 1]);
        tcg_temp_free_ptr(tcg_ctx, status);
    }
    return true;
}